

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::reportClose(Connection *this)

{
  TonkResult TVar1;
  _func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *p_Var2;
  TonkAppContextPtr pvVar3;
  bool bVar4;
  TonkConnection pTVar5;
  char *pcVar6;
  Connection *in_RDI;
  Connection *in_stack_000000d8;
  Connection *in_stack_00000128;
  atomic<bool> *in_stack_ffffffffffffffc8;
  
  bVar4 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffc8);
  if ((((bVar4 ^ 0xffU) & 1) == 0) && ((in_RDI->HasReportedClose & 1U) == 0)) {
    in_RDI->HasReportedClose = true;
    p_Var2 = (in_RDI->ConnectionConfig).OnClose;
    pvVar3 = (in_RDI->ConnectionConfig).AppContextPtr;
    pTVar5 = GetTonkConnection(in_RDI);
    TVar1 = (in_RDI->super_IConnection).SelfRefCount.ShutdownReason;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    (*p_Var2)(pvVar3,pTVar5,TVar1,pcVar6);
    sendDisconnectMessageToPeer(in_stack_000000d8);
    removeFromMaps(in_stack_00000128);
  }
  return;
}

Assistant:

void Connection::reportClose()
{
    if (SelfRefCount.NotShutdown() || HasReportedClose) {
        return;
    }
    HasReportedClose = true;

    // Invoke application OnClose() callback
    ConnectionConfig.OnClose(
        ConnectionConfig.AppContextPtr,
        GetTonkConnection(),
        static_cast<TonkResult>(SelfRefCount.ShutdownReason),
        SelfRefCount.ShutdownJson.c_str());

    sendDisconnectMessageToPeer();

    removeFromMaps();
}